

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::UsdPreviewSurface>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,UsdPreviewSurface *surface,string *prop_name,Property *out_prop)

{
  size_type *psVar1;
  bool *pbVar2;
  TypedTimeSamples<int> *this;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  string *in;
  long lVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Animatable<int> v;
  string err;
  Attribute attr;
  TimeSamples ts;
  PrimVar pvar;
  undefined1 local_958 [16];
  undefined1 local_948 [80];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e8;
  undefined1 local_8d8 [16];
  _Alloc_hider local_8c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c0;
  storage_union local_8b0;
  undefined **local_8a0;
  undefined1 local_898 [16];
  bool bStack_888;
  undefined7 uStack_887;
  bool bStack_880;
  undefined8 uStack_87f;
  undefined1 local_870 [24];
  AttrMetas AStack_858;
  storage_union local_650;
  undefined1 *local_640;
  storage_union local_638;
  undefined1 uStack_628;
  undefined7 uStack_627;
  undefined1 uStack_620;
  storage_union local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  undefined1 local_5f0 [8];
  string sStack_5e8;
  undefined7 uStack_5e7;
  undefined1 uStack_5e0;
  undefined8 uStack_5df;
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  undefined4 local_368;
  undefined4 uStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  local_948._32_8_ = local_948 + 0x30;
  local_948._40_8_ = 0;
  local_948[0x30] = '\0';
  iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar6 == 0) {
    bVar5 = ToProperty<tinyusdz::value::color3f>
                      (&surface->diffuseColor,out_prop,(string *)(local_948 + 0x20));
    if (!bVar5) {
      local_958._0_8_ = local_948;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_958,"Convert Property {} failed: {}\n","");
      pcVar3 = "inputs:diffuseColor";
LAB_0035cb1b:
      fmt::format<char[13],std::__cxx11::string>
                ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)(pcVar3 + 7),
                 (char (*) [13])(local_948 + 0x20),in_R8);
      goto LAB_0035cbde;
    }
    goto LAB_0035d4b4;
  }
  iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
  if (iVar6 == 0) {
    bVar5 = ToProperty<tinyusdz::value::color3f>
                      (&surface->emissiveColor,out_prop,(string *)(local_948 + 0x20));
    if (bVar5) goto LAB_0035d4b4;
    local_958._0_8_ = local_948;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_958,"Convert Property {} failed: {}\n","");
    pcVar3 = "inputs:emissiveColor";
LAB_0035cbc9:
    fmt::format<char[14],std::__cxx11::string>
              ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)(pcVar3 + 7),
               (char (*) [14])(local_948 + 0x20),in_R8);
LAB_0035cbde:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_allocated_capacity ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_948 + 0x60)) {
      local_600._8_8_ = local_8e8._8_8_;
      local_610.dynamic = &local_600;
    }
    else {
      local_610.dynamic = (void *)local_8f8._M_allocated_capacity;
    }
    local_600._M_allocated_capacity._1_7_ = local_8e8._M_allocated_capacity._1_7_;
    local_600._M_local_buf[0] = local_8e8._M_local_buf[0];
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    psVar1 = (size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10);
    *(size_type **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = psVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610.dynamic == &local_600) {
      *psVar1 = local_600._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_600._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = (pointer)local_610.dynamic;
      *(size_type *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_600._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_8f8._8_8_;
LAB_0035cc9e:
    local_600._M_allocated_capacity = (ulong)(uint7)local_8e8._M_allocated_capacity._1_7_ << 8;
    local_610._8_8_ = 0;
    local_610.dynamic = &local_600;
    local_8e8._M_local_buf[0] = 0;
    local_8f8._8_8_ = 0;
    local_8f8._M_allocated_capacity = (size_type)(local_948 + 0x60);
    if ((pointer)local_958._0_8_ != (pointer)local_948) {
      operator_delete((void *)local_958._0_8_,(ulong)(local_948._0_8_ + 1));
    }
  }
  else {
    iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
    if (iVar6 == 0) {
      bVar5 = ToProperty<tinyusdz::value::color3f>
                        (&surface->specularColor,out_prop,(string *)(local_948 + 0x20));
      if (!bVar5) {
        local_958._0_8_ = local_948;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_958,"Convert Property {} failed: {}\n","");
        pcVar3 = "inputs:specularColor";
        goto LAB_0035cbc9;
      }
    }
    else {
      iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
      if (iVar6 == 0) {
        local_8f8._M_allocated_capacity = (size_type)(local_948 + 0x60);
        local_8f8._8_8_ = 0;
        local_8e8._M_local_buf[0] = 0;
        local_8d8[4] = '\0';
        local_8d8._8_8_ = &local_8c0;
        local_8c8._M_p = (pointer)0x0;
        local_8c0._M_local_buf[0] = '\0';
        local_8a0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_8b0.dynamic = (void *)0x0;
        local_898[0] = '\0';
        local_898._8_8_ = 0;
        bStack_888 = false;
        uStack_887._0_3_ = 0;
        uStack_887._3_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
        bStack_880 = false;
        uStack_87f = 0;
        AStack_858.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
        AStack_858.elementSize.has_value_ = false;
        AStack_858.elementSize.contained = (storage_t<unsigned_int>)0x0;
        AStack_858.hidden.has_value_ = false;
        AStack_858.hidden.contained = (storage_t<bool>)0x0;
        AStack_858.comment.has_value_ = false;
        AStack_858.weight.contained = (storage_t<double>)0x0;
        AStack_858.connectability.has_value_ = false;
        AStack_858.bindMaterialAs.contained._16_8_ = 0;
        AStack_858.bindMaterialAs.contained._24_8_ = 0;
        AStack_858.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_858.bindMaterialAs.contained._8_8_ = 0;
        AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_header;
        AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        AStack_858.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.comment.contained._8_8_ = 0;
        AStack_858.comment.contained._16_8_ = 0;
        AStack_858.comment.contained._24_8_ = 0;
        AStack_858.comment.contained._32_8_ = 0;
        AStack_858.comment.contained._40_8_ = 0;
        AStack_858.customData.has_value_ = false;
        AStack_858.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.customData.contained._8_8_ = 0;
        AStack_858.customData.contained._16_8_ = 0;
        AStack_858.customData.contained._24_8_ = 0;
        AStack_858.customData.contained._32_8_ = 0;
        AStack_858.customData.contained._40_8_ = 0;
        AStack_858.weight.has_value_ = false;
        AStack_858.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
        ;
        AStack_858.connectability.contained._8_8_ = 0;
        AStack_858.connectability.contained._16_8_ = 0;
        AStack_858.connectability.contained._24_8_ = 0;
        AStack_858.outputName.has_value_ = false;
        AStack_858.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.outputName.contained._8_8_ = 0;
        AStack_858.outputName.contained._16_8_ = 0;
        AStack_858.outputName.contained._24_8_ = 0;
        AStack_858.renderType.has_value_ = false;
        AStack_858.sdrMetadata.has_value_ = false;
        AStack_858.renderType.contained._16_8_ = 0;
        AStack_858.renderType.contained._24_8_ = 0;
        AStack_858.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.renderType.contained._8_8_ = 0;
        AStack_858.displayName.has_value_ = false;
        AStack_858.sdrMetadata.contained._32_8_ = 0;
        AStack_858.sdrMetadata.contained._40_8_ = 0;
        AStack_858.sdrMetadata.contained._16_8_ = 0;
        AStack_858.sdrMetadata.contained._24_8_ = 0;
        AStack_858.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.sdrMetadata.contained._8_8_ = 0;
        AStack_858.displayGroup.has_value_ = false;
        AStack_858.displayName.contained._16_8_ = 0;
        AStack_858.displayName.contained._24_8_ = 0;
        AStack_858.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.displayName.contained._8_8_ = 0;
        AStack_858.bindMaterialAs.has_value_ = false;
        AStack_858.displayGroup.contained._16_8_ = 0;
        AStack_858.displayGroup.contained._24_8_ = 0;
        AStack_858.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        AStack_858.displayGroup.contained._8_8_ = 0;
        local_870[0x10] = 0;
        stack0xfffffffffffff7a1 = 0;
        local_870._0_8_ = (pointer)0x0;
        local_870[8] = 0;
        local_870._9_7_ = 0;
        AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        AStack_858.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        AStack_858.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        AStack_858.stringData.
        super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_8d8._0_4_ = 0;
        local_600._M_allocated_capacity._0_4_ = 0x746e69;
        local_610._8_8_ = 3;
        AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             AStack_858.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_610.dynamic = &local_600;
        ::std::__cxx11::string::_M_assign((string *)(local_8d8 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610.dynamic != &local_600) {
          operator_delete(local_610.dynamic,local_600._M_allocated_capacity + 1);
        }
        if ((surface->useSpecularWorkflow)._blocked == true) {
          local_898[0] = '\x01';
        }
        if ((surface->useSpecularWorkflow)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (surface->useSpecularWorkflow)._paths.
            super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_870,
                     &(surface->useSpecularWorkflow)._paths);
        }
        lVar8 = 600;
        if ((surface->useSpecularWorkflow)._attrib.has_value_ != false) {
          lVar8 = 0x228;
        }
        pbVar2 = &(surface->useSpecularWorkflow)._metas.interpolation.has_value_ + lVar8;
        this = (TypedTimeSamples<int> *)(local_958 + 8);
        local_958._4_2_ = *(undefined2 *)(pbVar2 + 4);
        local_958._0_4_ = *(undefined4 *)pbVar2;
        local_948._72_8_ = &surface->useSpecularWorkflow;
        ::std::
        vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
        ::vector((vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                  *)this,(vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                          *)(pbVar2 + 8));
        local_948[0x10] =
             *(char *)((long)&(surface->useSpecularWorkflow)._metas.comment.contained + lVar8);
        local_600._M_allocated_capacity =
             (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_610.dynamic =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_600._8_8_ = local_600._8_8_ & 0xffffffffffffff00;
        local_5f0 = (undefined1  [8])0x0;
        sStack_5e8 = (string)0x0;
        uStack_5e7 = 0;
        uStack_5e0 = 0;
        uStack_5df = 0;
        if (local_948[0x10] == '\x01') {
          TypedTimeSamples<int>::update(this);
        }
        local_948._64_8_ = __return_storage_ptr__;
        if (local_948._0_8_ != local_958._8_8_) {
          if (local_948[0x10] == '\x01') {
            TypedTimeSamples<int>::update(this);
          }
          uStack_628 = 0;
          uStack_627 = 0;
          uStack_620 = 0;
          local_638.dynamic = (void *)0x0;
          local_638._8_1_ = 0;
          local_638._9_7_ = 0;
          if (local_948._0_8_ != local_958._8_8_) {
            lVar8 = 8;
            uVar9 = 0;
            do {
              local_640 = linb::any::vtable_for_type<int>()::table;
              local_650._0_4_ =
                   *(undefined4 *)((long)&(((string *)local_958._8_8_)->_M_dataplus)._M_p + lVar8);
              tinyusdz::value::TimeSamples::add_sample
                        ((TimeSamples *)&local_638,*(double *)(local_958._8_8_ + lVar8 + -8),
                         (Value *)&local_650);
              if (local_640 != (undefined1 *)0x0) {
                (**(code **)(local_640 + 0x20))(&local_650);
                local_640 = (undefined1 *)0x0;
              }
              uVar9 = uVar9 + 1;
              lVar8 = lVar8 + 0x10;
            } while (uVar9 < (ulong)((long)(local_948._0_8_ - local_958._8_8_) >> 4));
          }
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)local_5f0,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&local_638);
          uStack_5df = CONCAT17(uStack_620,(undefined7)uStack_5df);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)&local_638);
        }
        __return_storage_ptr__ =
             (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_948._64_8_;
        if (local_958[4] == '\x01') {
          cVar4 = local_958[5];
          if (local_958[5] == '\0') {
            uStack_628 = 0x30;
            uStack_627 = 0x4b6f;
            local_638._0_4_ = local_958._0_4_;
            linb::any::operator=((any *)&local_610,(any *)&local_638);
            if (CONCAT71(uStack_627,uStack_628) != 0) {
              (**(code **)(CONCAT71(uStack_627,uStack_628) + 0x20))(&local_638);
              uStack_628 = 0;
              uStack_627 = 0;
            }
          }
          else {
            ::std::__cxx11::string::append(local_948 + 0x20);
          }
          if (cVar4 == '\0') goto LAB_0035d161;
          bVar5 = false;
        }
        else {
LAB_0035d161:
          Attribute::set_var((Attribute *)(local_948 + 0x50),(PrimVar *)&local_610);
          bVar5 = true;
        }
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_5f0);
        if ((undefined **)local_600._M_allocated_capacity != (undefined **)0x0) {
          (**(code **)(local_600._M_allocated_capacity + 0x20))(&local_610);
          local_600._M_allocated_capacity = 0;
        }
        if ((pointer)local_958._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_958._8_8_,local_948._8_8_ - local_958._8_8_);
        }
        if (bVar5) {
          AttrMetas::operator=(&AStack_858,(AttrMetas *)local_948._72_8_);
          Property::Property((Property *)&local_610,(Attribute *)(local_948 + 0x50),false);
          ::std::__cxx11::string::operator=((string *)out_prop,(string *)&local_610);
          (out_prop->_attrib)._variability = local_5f0._0_4_;
          (out_prop->_attrib)._varying_authored = local_5f0[4];
          ::std::__cxx11::string::operator=((string *)&(out_prop->_attrib)._type_name,&sStack_5e8);
          linb::any::operator=((any *)&(out_prop->_attrib)._var,&local_5c8);
          (out_prop->_attrib)._var._blocked = local_5b0;
          local_958._0_8_ =
               (out_prop->_attrib)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_958._8_8_ =
               *(pointer *)
                ((long)&(out_prop->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 8);
          local_948._0_8_ =
               *(pointer *)
                ((long)&(out_prop->_attrib)._var._ts._samples.
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
          (out_prop->_attrib)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = local_5a8;
          *(pointer *)
           ((long)&(out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 8) = local_5a0;
          *(pointer *)
           ((long)&(out_prop->_attrib)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = local_598;
          local_5a8 = (pointer)0x0;
          local_5a0 = (pointer)0x0;
          local_598 = (pointer)0x0;
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_958);
          (out_prop->_attrib)._var._ts._dirty = local_590;
          local_958._0_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_958._8_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_948._0_8_ =
               (out_prop->_attrib)._paths.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = local_588;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = local_580;
          (out_prop->_attrib)._paths.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_578;
          local_588 = (pointer)0x0;
          local_580 = (pointer)0x0;
          local_578 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
          AttrMetas::operator=(&(out_prop->_attrib)._metas,&AStack_570);
          out_prop->_listOpQual = local_368;
          out_prop->_type = uStack_364;
          (out_prop->_rel).type = local_360;
          Path::operator=(&(out_prop->_rel).targetPath,&PStack_358);
          local_958._0_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_958._8_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_948._0_8_ =
               (out_prop->_rel).targetPathVector.
               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start = local_288;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish = local_280;
          (out_prop->_rel).targetPathVector.
          super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_278;
          local_288 = (pointer)0x0;
          local_280 = (pointer)0x0;
          local_278 = (pointer)0x0;
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_958);
          (out_prop->_rel).listOpQual = local_270;
          AttrMetas::operator=(&(out_prop->_rel)._metas,&AStack_268);
          (out_prop->_rel)._varying_authored = local_60;
          ::std::__cxx11::string::operator=((string *)&out_prop->_prop_value_type_name,asStack_58);
          __return_storage_ptr__ =
               (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_948._64_8_;
          out_prop->_has_custom = local_38;
          Property::~Property((Property *)&local_610);
        }
        AttrMetas::~AttrMetas(&AStack_858);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_870);
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)(local_898 + 8));
        if (local_8a0 != (undefined **)0x0) {
          (*(code *)local_8a0[4])(&local_8b0);
          local_8a0 = (undefined **)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d8._8_8_ != &local_8c0) {
          operator_delete((void *)local_8d8._8_8_,
                          CONCAT71(local_8c0._M_allocated_capacity._1_7_,local_8c0._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f8._M_allocated_capacity !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_948 + 0x60)) {
          operator_delete((void *)local_8f8._M_allocated_capacity,
                          CONCAT71(local_8e8._M_allocated_capacity._1_7_,local_8e8._M_local_buf[0])
                          + 1);
        }
        if (!bVar5) {
          local_958._0_8_ = local_948;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_958,"Convert Property {} failed: {}\n","");
          fmt::format<char[20],std::__cxx11::string>
                    ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)0x42d8c1,
                     (char (*) [20])(local_948 + 0x20),in_R8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f8._M_allocated_capacity ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_948 + 0x60)) {
            local_600._8_8_ = local_8e8._8_8_;
            local_610.dynamic = &local_600;
          }
          else {
            local_610.dynamic = (void *)local_8f8._M_allocated_capacity;
          }
          local_600._M_allocated_capacity._1_7_ = local_8e8._M_allocated_capacity._1_7_;
          local_600._M_local_buf[0] = local_8e8._M_local_buf[0];
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = false;
          psVar1 = (size_type *)
                   ((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x10);
          *(size_type **)
           &(__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0 = psVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_610.dynamic == &local_600) {
            *psVar1 = local_600._M_allocated_capacity;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x18) = local_600._8_8_;
          }
          else {
            (__return_storage_ptr__->contained).
            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .field_0.m_error._M_dataplus._M_p = (pointer)local_610.dynamic;
            *(size_type *)
             ((long)&(__return_storage_ptr__->contained).
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .field_0 + 0x10) = local_600._M_allocated_capacity;
          }
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_string_length = local_8f8._8_8_;
          goto LAB_0035cc9e;
        }
      }
      else {
        iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
        if (iVar6 == 0) {
          bVar5 = ToProperty<float>(&surface->metallic,out_prop,(string *)(local_948 + 0x20));
          if (!bVar5) {
            local_958._0_8_ = local_948;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_958,"Convert Property {} failed: {}\n","");
            fmt::format<char[9],std::__cxx11::string>
                      ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)0x42d822,
                       (char (*) [9])(local_948 + 0x20),in_R8);
            goto LAB_0035cbde;
          }
        }
        else {
          iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
          if (iVar6 == 0) {
            bVar5 = ToProperty<float>(&surface->clearcoat,out_prop,(string *)(local_948 + 0x20));
            if (!bVar5) {
              local_958._0_8_ = local_948;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_958,"Convert Property {} failed: {}\n","");
              in = (string *)0x42d832;
LAB_0035d691:
              fmt::format<char[10],std::__cxx11::string>
                        ((string *)(local_948 + 0x50),(fmt *)local_958,in,
                         (char (*) [10])(local_948 + 0x20),in_R8);
              goto LAB_0035cbde;
            }
          }
          else {
            iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
            if (iVar6 == 0) {
              bVar5 = ToProperty<float>(&surface->clearcoatRoughness,out_prop,
                                        (string *)(local_948 + 0x20));
              if (!bVar5) {
                local_958._0_8_ = local_948;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_958,"Convert Property {} failed: {}\n","");
                fmt::format<char[19],std::__cxx11::string>
                          ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)0x42d843,
                           (char (*) [19])(local_948 + 0x20),in_R8);
                goto LAB_0035cbde;
              }
            }
            else {
              iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
              if (iVar6 == 0) {
                bVar5 = ToProperty<float>(&surface->roughness,out_prop,(string *)(local_948 + 0x20))
                ;
                if (!bVar5) {
                  local_958._0_8_ = local_948;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_958,"Convert Property {} failed: {}\n","");
                  in = (string *)0x42d7fc;
                  goto LAB_0035d691;
                }
              }
              else {
                iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                if (iVar6 == 0) {
                  bVar5 = ToProperty<float>(&surface->opacity,out_prop,(string *)(local_948 + 0x20))
                  ;
                  if (!bVar5) {
                    local_958._0_8_ = local_948;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_958,"Convert Property {} failed: {}\n","");
                    fmt::format<char[8],std::__cxx11::string>
                              ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)0x42d85d,
                               (char (*) [8])(local_948 + 0x20),in_R8);
                    goto LAB_0035cbde;
                  }
                }
                else {
                  iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                  if (iVar6 == 0) {
                    bVar5 = ToProperty<float>(&surface->opacityThreshold,out_prop,
                                              (string *)(local_948 + 0x20));
                    if (!bVar5) {
                      local_958._0_8_ = local_948;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_958,"Convert Property {} failed: {}\n","");
                      fmt::format<char[17],std::__cxx11::string>
                                ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)0x42d86c,
                                 (char (*) [17])(local_948 + 0x20),in_R8);
                      goto LAB_0035cbde;
                    }
                  }
                  else {
                    iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                    if (iVar6 == 0) {
                      bVar5 = ToProperty<float>(&surface->ior,out_prop,(string *)(local_948 + 0x20))
                      ;
                      if (!bVar5) {
                        local_958._0_8_ = local_948;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_958,"Convert Property {} failed: {}\n","");
                        fmt::format<char[4],std::__cxx11::string>
                                  ((string *)(local_948 + 0x50),(fmt *)local_958,(string *)0x42d884,
                                   (char (*) [4])(local_948 + 0x20),in_R8);
                        goto LAB_0035cbde;
                      }
                    }
                    else {
                      iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                      if (iVar6 == 0) {
                        bVar5 = ToProperty<tinyusdz::value::normal3f>
                                          (&surface->normal,out_prop,(string *)(local_948 + 0x20));
                        if (!bVar5) {
                          local_958._0_8_ = local_948;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_958,"Convert Property {} failed: {}\n","");
                          fmt::format<char[7],std::__cxx11::string>
                                    ((string *)(local_948 + 0x50),(fmt *)local_958,
                                     (string *)0x42d88f,(char (*) [7])(local_948 + 0x20),in_R8);
                          goto LAB_0035cbde;
                        }
                      }
                      else {
                        iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                        if (iVar6 == 0) {
                          bVar5 = ToProperty<float>(&surface->displacement,out_prop,
                                                    (string *)(local_948 + 0x20));
                          if (!bVar5) {
                            local_958._0_8_ = local_948;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_958,"Convert Property {} failed: {}\n","");
                            pcVar3 = "inputs:displacement";
                            goto LAB_0035cb1b;
                          }
                        }
                        else {
                          iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                          if (iVar6 == 0) {
                            bVar5 = ToProperty<float>(&surface->occlusion,out_prop,
                                                      (string *)(local_948 + 0x20));
                            if (!bVar5) {
                              local_958._0_8_ = local_948;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_958,"Convert Property {} failed: {}\n","");
                              in = (string *)0x42d8b0;
                              goto LAB_0035d691;
                            }
                          }
                          else {
                            iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                            if (iVar6 == 0) {
                              if ((surface->outputsSurface)._authored != true) goto LAB_0035d97b;
LAB_0035d8e2:
                              local_8f8._M_allocated_capacity =
                                   (size_type)
                                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(local_948 + 0x60);
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)(local_948 + 0x50),"token","");
                              Property::Property((Property *)&local_610);
                              local_38 = false;
                              uStack_364 = 0;
                              ::std::__cxx11::string::_M_assign(&sStack_5e8);
                              Property::operator=(out_prop,(Property *)&local_610);
                              Property::~Property((Property *)&local_610);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_8f8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(local_948 + 0x60)) {
                                operator_delete((void *)local_8f8._M_allocated_capacity,
                                                CONCAT71(local_8e8._M_allocated_capacity._1_7_,
                                                         local_8e8._M_local_buf[0]) + 1);
                              }
                            }
                            else {
                              iVar6 = ::std::__cxx11::string::compare((char *)prop_name);
                              if (iVar6 == 0) {
                                if ((surface->outputsDisplacement)._authored == true)
                                goto LAB_0035d8e2;
LAB_0035d97b:
                                (__return_storage_ptr__->contained).
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .m_has_value = true;
                                (__return_storage_ptr__->contained).
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .field_0.m_value = false;
                                goto LAB_0035d4bc;
                              }
                              cVar7 = ::std::
                                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                              *)&(surface->super_ShaderNode).super_UsdShadePrim.
                                                 props,prop_name);
                              if ((_Rb_tree_header *)cVar7._M_node ==
                                  &(surface->super_ShaderNode).super_UsdShadePrim.props._M_t._M_impl
                                   .super__Rb_tree_header) {
                                (__return_storage_ptr__->contained).
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .m_has_value = true;
                                (__return_storage_ptr__->contained).
                                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                .field_0.m_value = false;
                                goto LAB_0035d4bc;
                              }
                              Property::operator=(out_prop,(Property *)(cVar7._M_node + 2));
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0035d4b4:
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
LAB_0035d4bc:
  if ((undefined1 *)local_948._32_8_ != local_948 + 0x30) {
    operator_delete((void *)local_948._32_8_,CONCAT71(local_948._49_7_,local_948[0x30]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const UsdPreviewSurface &surface, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  DCOUT("prop_name = " << prop_name);
  std::string err;

  TO_PROPERTY("diffuseColor", surface.diffuseColor)
  TO_PROPERTY("emissiveColor", surface.emissiveColor)
  TO_PROPERTY("specularColor", surface.specularColor)
  TO_PROPERTY("useSpecularWorkflow", surface.useSpecularWorkflow)
  TO_PROPERTY("metallic", surface.metallic)
  TO_PROPERTY("clearcoat", surface.clearcoat)
  TO_PROPERTY("clearcoatRoughness", surface.clearcoatRoughness)
  TO_PROPERTY("roughness", surface.roughness)
  TO_PROPERTY("opacity", surface.opacity)
  TO_PROPERTY("opacityThreshold", surface.opacityThreshold)
  TO_PROPERTY("ior", surface.ior)
  TO_PROPERTY("normal", surface.normal)
  TO_PROPERTY("displacement", surface.displacement)
  TO_PROPERTY("occlusion", surface.occlusion)

  if (prop_name == "outputs:surface") {
    if (surface.outputsSurface.authored()) {
      // empty. type info only
      (*out_prop) =
          Property::MakeEmptyAttrib(value::kToken, /* custom */ false);
    } else {
      // Not authored
      return false;
    }
  } else if (prop_name == "outputs:displacement") {
    if (surface.outputsDisplacement.authored()) {
      // empty. type info only
      (*out_prop) =
          Property::MakeEmptyAttrib(value::kToken, /* custom */ false);
    } else {
      // Not authored
      return false;
    }
  } else {
    const auto it = surface.props.find(prop_name);
    if (it == surface.props.end()) {
      // Attribute not found.
      // TODO: report warn?
      return false;
    }

    (*out_prop) = it->second;
  }

  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}